

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::connection::async_write_response
          (connection *this,response *response,bool complete_response,ehandler *h)

{
  bool bVar1;
  int iVar2;
  unspecified_bool_type uVar3;
  undefined8 *puVar4;
  async_write_binder *paVar5;
  callback *rhs;
  byte in_DL;
  long *in_RDI;
  error_code e;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> tmp;
  connection *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  byte bVar6;
  async_write_binder *in_stack_ffffffffffffff08;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *in_stack_ffffffffffffff10;
  undefined1 local_a8 [8];
  undefined1 local_a0 [52];
  undefined4 local_6c;
  error_code local_60 [3];
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> local_28 [2];
  byte local_11;
  
  local_11 = in_DL & 1;
  booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::intrusive_ptr(local_28)
  ;
  uVar3 = booster::intrusive_ptr::operator_cast_to__((intrusive_ptr *)(in_RDI + 0x1e));
  if (uVar3 != 0xffffffffffffffff) {
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::swap
              (local_28,(intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)
                        (in_RDI + 0x1e));
  }
  bVar1 = booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::operator!
                    (local_28);
  if (bVar1) {
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[4] = 0;
    puVar4[5] = 0;
    puVar4[2] = 0;
    puVar4[3] = 0;
    *puVar4 = 0;
    puVar4[1] = 0;
    async_write_binder::async_write_binder
              ((async_write_binder *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::operator=
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  self(in_stack_fffffffffffffee8);
  booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::operator->(local_28);
  std::shared_ptr<cppcms::impl::cgi::connection>::operator=
            ((shared_ptr<cppcms::impl::cgi::connection> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (shared_ptr<cppcms::impl::cgi::connection> *)in_stack_fffffffffffffee8);
  std::shared_ptr<cppcms::impl::cgi::connection>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::connection> *)0x37dedb);
  booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::operator->(local_28);
  booster::callback<void_(cppcms::http::context::completion_type)>::operator=
            ((callback<void_(cppcms::http::context::completion_type)> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (callback<void_(cppcms::http::context::completion_type)> *)in_stack_fffffffffffffee8);
  bVar6 = local_11;
  paVar5 = booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::operator->
                     (local_28);
  paVar5->complete_response = (bool)(bVar6 & 1);
  std::error_code::error_code
            ((error_code *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  iVar2 = cppcms::http::response::flush_async_chunk
                    ((response *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                     (error_code *)in_stack_fffffffffffffee8);
  if ((iVar2 == 0) &&
     (in_stack_fffffffffffffef7 = has_pending((connection *)0x37df7c),
     (bool)in_stack_fffffffffffffef7)) {
    booster::aio::const_buffer::const_buffer((const_buffer *)0x37e090);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::intrusive_ptr
              ((intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)
               in_stack_fffffffffffffee8);
    booster::callback<void_(const_std::error_code_&)>::
    callback<cppcms::impl::cgi::connection::async_write_binder>
              ((callback<void_(const_std::error_code_&)> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)
               in_stack_fffffffffffffee8);
    (**(code **)(*in_RDI + 0x28))(in_RDI,local_a0,0,local_a8);
    booster::callback<void_(const_std::error_code_&)>::~callback
              ((callback<void_(const_std::error_code_&)> *)0x37e0dd);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
              ((intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x37e0f1);
    local_6c = 0;
  }
  else {
    rhs = (callback *)(**(code **)(*in_RDI + 0x60))();
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::intrusive_ptr
              ((intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)rhs);
    booster::callback<void_(const_std::error_code_&)>::
    callback<cppcms::impl::cgi::connection::async_write_binder>
              ((callback<void_(const_std::error_code_&)> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)rhs);
    booster::aio::io_service::post(rhs,local_60);
    booster::callback<void_(const_std::error_code_&)>::~callback
              ((callback<void_(const_std::error_code_&)> *)0x37dffa);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
              ((intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    local_6c = 1;
  }
  booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  return;
}

Assistant:

void connection::async_write_response(	http::response &response,
					bool complete_response,
					ehandler const &h)
{
	//  prepare cached binder
	booster::intrusive_ptr<connection::async_write_binder> tmp;
	if(cached_async_write_binder_) {
		tmp.swap(cached_async_write_binder_);
	}
	if(!tmp) {
		tmp = new connection::async_write_binder();
	}
	tmp->conn = self();
	tmp->h = h;
	tmp->complete_response = complete_response;
	// ready

	booster::system::error_code e;
	if(response.flush_async_chunk(e)!=0 || !has_pending()) {
		get_io_service().post(tmp,e);
		return;
	}
	async_write(booster::aio::const_buffer(),false,tmp);
}